

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O2

void __thiscall
ValidateVulnerability::ReadFirstVulnerabilityLine
          (ValidateVulnerability *this,OASIS_FLOAT *totalProbability)

{
  Validate *this_00;
  int iVar1;
  char *pcVar2;
  
  this_00 = &this->super_Validate;
  pcVar2 = fgets(this_00->line_,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    iVar1 = ScanLine(this);
    if (iVar1 == 4) {
      CheckVulnerabilityID(this);
      StoreLine(this);
      this->maxDamageBin_ = (this->v_).damage_bin_id;
      *totalProbability = (this->v_).probability;
      if (this->allIntensityBinsCheck_ == true) {
        SetIntensityBinIDs(this);
        return;
      }
      return;
    }
    fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
            (ulong)(uint)(this->super_Validate).lineno_,this_00);
    Validate::PrintErrorMessage(this_00);
  }
  fwrite("ERROR: Empty file\n",0x12,1,_stderr);
  Validate::PrintErrorMessage(this_00);
  return;
}

Assistant:

void ValidateVulnerability::ReadFirstVulnerabilityLine(OASIS_FLOAT &totalProbability) {

  if (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      CheckVulnerabilityID();
      StoreLine();
      maxDamageBin_ = v_.damage_bin_id;   // Set initial value
      totalProbability = v_.probability;
      if (allIntensityBinsCheck_) SetIntensityBinIDs();

      return;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  fprintf(stderr, "ERROR: Empty file\n");
  PrintErrorMessage();

}